

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

IndexRange __thiscall
iDynTree::BerdyHelper::getRangeJointVariable
          (BerdyHelper *this,BerdyDynamicVariablesTypes dynamicVariableType,JointIndex idx)

{
  bool bVar1;
  int iVar2;
  TraversalIndex idx_00;
  long in_RDX;
  BerdyDynamicVariablesTypes in_ESI;
  BerdyHelper *in_RDI;
  int totalSizeOfLinkVariables;
  IndexRange ret;
  undefined4 in_stack_ffffffffffffffb0;
  Model *in_stack_ffffffffffffffc0;
  IndexRange local_10;
  
  bVar1 = isJointBerdyDynamicVariable(in_ESI);
  if (bVar1) {
    if ((in_RDI->m_options).berdyVariant == ORIGINAL_BERDY_FIXED_BASE) {
      idx_00 = getTraversalIndexFromJointIndex
                         (in_stack_ffffffffffffffc0,(Traversal *)in_RDI,
                          CONCAT44(in_ESI,in_stack_ffffffffffffffb0));
      local_10 = getRangeOriginalBerdyFixedBase(in_RDI,in_ESI,idx_00);
    }
    else {
      iVar2 = iDynTree::Model::getNrOfLinks();
      if (in_ESI == JOINT_WRENCH) {
        local_10.size = 6;
        local_10.offset = (long)(iVar2 * 0xc) + in_RDX * 6;
      }
      else {
        local_10 = (IndexRange)iDynTree::IndexRange::InvalidRange();
      }
    }
  }
  else {
    local_10 = (IndexRange)iDynTree::IndexRange::InvalidRange();
  }
  return local_10;
}

Assistant:

IndexRange BerdyHelper::getRangeJointVariable(BerdyDynamicVariablesTypes dynamicVariableType, JointIndex idx) const
{
    if( !isJointBerdyDynamicVariable(dynamicVariableType) )
    {
        assert(false);
        return IndexRange::InvalidRange();
    }

    if (m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE)
    {
        return getRangeOriginalBerdyFixedBase(dynamicVariableType,
                                              getTraversalIndexFromJointIndex(m_model, m_dynamicsTraversal, idx));
    }
    else
    {
        IndexRange ret;
        assert(m_options.berdyVariant == BERDY_FLOATING_BASE);
        assert(m_options.includeAllNetExternalWrenchesAsDynamicVariables);

        int totalSizeOfLinkVariables  = 12*m_model.getNrOfLinks();

        switch (dynamicVariableType)
        {
            case JOINT_WRENCH:
                ret.offset = totalSizeOfLinkVariables + 6*idx;
                ret.size = 6;
                break;
            default:
                assert(false);
                ret = IndexRange::InvalidRange();
                break;
        }

        return ret;
    }
}